

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,cmLinkLineComputer *linkLineComputer,string *config,
          string *linkLibs,string *flags,string *linkFlags,string *frameworkPath,string *linkPath,
          cmGeneratorTarget *target)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmMakefile *pcVar4;
  pointer pcVar5;
  cmSourceFile *this_00;
  size_type sVar6;
  bool bVar7;
  TargetType TVar8;
  int iVar9;
  long *plVar10;
  string *psVar11;
  undefined8 *puVar12;
  long *plVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined8 uVar14;
  pointer ppcVar15;
  string *opt;
  char *pcVar16;
  pointer *pppcVar17;
  _Alloc_hider _Var18;
  char *__end;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  string buildType;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string linkLanguage;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  cmComputeLinkInformation *local_98;
  string *local_90;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_88;
  string local_68;
  cmLinkLineComputer *local_48;
  string *local_40;
  cmOutputConverter *local_38;
  
  local_40 = linkLibs;
  cmsys::SystemTools::UpperCase(&local_b8,config);
  local_90 = config;
  local_98 = cmGeneratorTarget::GetLinkInformation(target,config);
  local_48 = linkLineComputer;
  (*linkLineComputer->_vptr_cmLinkLineComputer[4])(&local_68,linkLineComputer,target,&local_b8);
  TVar8 = cmGeneratorTarget::GetType(target);
  switch(TVar8) {
  case EXECUTABLE:
    pcVar4 = this->Makefile;
    paVar2 = &local_118.field_2;
    local_118._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"CMAKE_EXE_LINKER_FLAGS","");
    psVar11 = cmMakefile::GetSafeDefinition(pcVar4,&local_118);
    std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar11->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)linkFlags);
    if (local_b8._M_string_length != 0) {
      local_118._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"CMAKE_EXE_LINKER_FLAGS_","");
      std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_b8._M_dataplus._M_p);
      psVar11 = cmMakefile::GetSafeDefinition(this->Makefile,&local_118);
      std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar11->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_68._M_string_length == 0) {
      psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      std::operator+(&local_118,"CMake can not determine linker language for target: ",psVar11);
      cmSystemTools::Error(&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0030f75e;
    }
    AddLanguageFlagsForLinking(this,flags,target,&local_68,&local_b8);
    if (local_98 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,local_98,local_48,local_40,frameworkPath,linkPath);
    }
    pcVar4 = this->Makefile;
    local_118._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"BUILD_SHARED_LIBS","");
    pcVar16 = cmMakefile::GetDefinition(pcVar4,&local_118);
    bVar7 = cmSystemTools::IsOn(pcVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"CMAKE_SHARED_BUILD_","");
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_d8,(ulong)local_68._M_dataplus._M_p);
      paVar3 = &local_f8.field_2;
      plVar13 = plVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar13) {
        local_f8.field_2._M_allocated_capacity = *plVar13;
        local_f8.field_2._8_4_ = (undefined4)plVar10[3];
        local_f8.field_2._12_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
        local_f8._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *plVar13;
        local_f8._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_f8._M_string_length = plVar10[1];
      *plVar10 = (long)plVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      pppcVar17 = &local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pppcVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"_FLAGS","");
      uVar14 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar3) {
        uVar14 = local_f8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 <
          (pointer)((long)local_88.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish + local_f8._M_string_length)) {
        ppcVar15 = (pointer)0xf;
        if (local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)pppcVar17) {
          ppcVar15 = local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        if (ppcVar15 <
            (pointer)((long)local_88.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish + local_f8._M_string_length))
        goto LAB_0030f87e;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_88,0,(char *)0x0,(ulong)local_f8._M_dataplus._M_p);
      }
      else {
LAB_0030f87e:
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_f8,
                             (ulong)local_88.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
      }
      psVar1 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_118.field_2._M_allocated_capacity = *psVar1;
        local_118.field_2._8_8_ = puVar12[3];
        local_118._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar1;
        local_118._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_118._M_string_length = puVar12[1];
      *puVar12 = psVar1;
      puVar12[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if (local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)pppcVar17) {
        operator_delete(local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)local_88.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar3) {
        operator_delete(local_f8._M_dataplus._M_p,
                        (ulong)(local_f8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      psVar11 = cmMakefile::GetSafeDefinition(this->Makefile,&local_118);
      std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar11->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    local_118._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"WIN32_EXECUTABLE","");
    bVar7 = cmGeneratorTarget::GetPropertyAsBool(target,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = this->Makefile;
    if (bVar7) {
      local_118._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"CMAKE_CREATE_WIN32_EXE","");
      psVar11 = cmMakefile::GetSafeDefinition(pcVar4,&local_118);
      std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar11->_M_dataplus)._M_p);
    }
    else {
      local_118._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"CMAKE_CREATE_CONSOLE_EXE","");
      psVar11 = cmMakefile::GetSafeDefinition(pcVar4,&local_118);
      std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar11->_M_dataplus)._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)linkFlags);
    bVar7 = cmGeneratorTarget::IsExecutableWithExports(target);
    if (bVar7) {
      local_118._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"CMAKE_EXE_EXPORTS_","");
      std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_68._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_118);
      psVar11 = cmMakefile::GetSafeDefinition(this->Makefile,&local_118);
      std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar11->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    GetLinkLibsCMP0065(&local_118,this,&local_68,target);
    if ((undefined1 *)local_118._M_string_length != (undefined1 *)0x0) {
      std::__cxx11::string::_M_append((char *)linkFlags,(ulong)local_118._M_dataplus._M_p);
      std::__cxx11::string::append((char *)linkFlags);
    }
    paVar3 = &local_f8.field_2;
    local_f8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"LINK_FLAGS","");
    pcVar16 = cmGeneratorTarget::GetProperty(target,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar3) {
      operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1))
      ;
    }
    if (pcVar16 != (char *)0x0) {
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if (local_b8._M_string_length != 0) {
      local_f8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"LINK_FLAGS_","");
      std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_b8._M_dataplus._M_p);
      pcVar16 = cmGeneratorTarget::GetProperty(target,&local_f8);
      if (pcVar16 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar3) {
        operator_delete(local_f8._M_dataplus._M_p,
                        (ulong)(local_f8.field_2._M_allocated_capacity + 1));
      }
    }
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    cmGeneratorTarget::GetLinkOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_f8,local_90,&local_68);
    sVar6 = local_f8._M_string_length;
    for (_Var18._M_p = local_f8._M_dataplus._M_p; _Var18._M_p != (pointer)sVar6;
        _Var18._M_p = _Var18._M_p + 0x20) {
      (*this->_vptr_cmLocalGenerator[8])(this,linkFlags,_Var18._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    break;
  case STATIC_LIBRARY:
    GetStaticLibraryFlags(this,linkFlags,&local_b8,&local_68,target);
    break;
  case SHARED_LIBRARY:
    pcVar16 = "CMAKE_SHARED_LINKER_FLAGS";
    goto LAB_0030f1d0;
  case MODULE_LIBRARY:
    pcVar16 = "CMAKE_MODULE_LINKER_FLAGS";
LAB_0030f1d0:
    pcVar4 = this->Makefile;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,pcVar16,pcVar16 + 0x19);
    cmMakefile::GetSafeDefinition(pcVar4,&local_118);
    std::__cxx11::string::_M_assign((string *)linkFlags);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)linkFlags);
    if (local_b8._M_string_length != 0) {
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,pcVar16,pcVar16 + 0x19);
      std::__cxx11::string::append((char *)&local_118);
      std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_b8._M_dataplus._M_p);
      psVar11 = cmMakefile::GetSafeDefinition(this->Makefile,&local_118);
      std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar11->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar4 = this->Makefile;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"WIN32","");
    bVar7 = cmMakefile::IsOn(pcVar4,&local_118);
    if (bVar7) {
      pcVar4 = this->Makefile;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"CYGWIN","");
      bVar7 = cmMakefile::IsOn(pcVar4,&local_f8);
      if (bVar7) {
        bVar7 = false;
      }
      else {
        pcVar4 = this->Makefile;
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"MINGW","");
        bVar7 = cmMakefile::IsOn(pcVar4,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        bVar7 = !bVar7;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        (ulong)(local_f8.field_2._M_allocated_capacity + 1));
      }
    }
    else {
      bVar7 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) {
      local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGeneratorTarget::GetSourceFiles(target,&local_88,&local_b8);
      pcVar4 = this->Makefile;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"CMAKE_LINK_DEF_FILE_FLAG","");
      psVar11 = cmMakefile::GetSafeDefinition(pcVar4,&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      pcVar5 = (psVar11->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,pcVar5,pcVar5 + psVar11->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        (ulong)(local_f8.field_2._M_allocated_capacity + 1));
      }
      ppcVar15 = local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_38 = &this->super_cmOutputConverter;
        pppcVar17 = (pointer *)
                    local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        do {
          this_00 = (cmSourceFile *)*pppcVar17;
          psVar11 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
          iVar9 = std::__cxx11::string::compare((char *)psVar11);
          if (iVar9 == 0) {
            std::__cxx11::string::_M_append((char *)linkFlags,(ulong)local_118._M_dataplus._M_p);
            psVar11 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
            cmsys::SystemTools::CollapseFullPath(&local_d8,psVar11);
            cmOutputConverter::ConvertToOutputFormat(&local_f8,local_38,&local_d8,SHELL);
            std::__cxx11::string::_M_append((char *)linkFlags,(ulong)local_f8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,
                              (ulong)(local_f8.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)linkFlags);
          }
          pppcVar17 = pppcVar17 + 1;
        } while ((pointer)pppcVar17 != ppcVar15);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"LINK_FLAGS","");
    pcVar16 = cmGeneratorTarget::GetProperty(target,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (pcVar16 != (char *)0x0) {
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if (local_b8._M_string_length != 0) {
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"LINK_FLAGS_","");
      std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_b8._M_dataplus._M_p);
      pcVar16 = cmGeneratorTarget::GetProperty(target,&local_118);
      if (pcVar16 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    cmGeneratorTarget::GetLinkOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_118,local_90,&local_68);
    sVar6 = local_118._M_string_length;
    for (_Var18._M_p = local_118._M_dataplus._M_p; _Var18._M_p != (pointer)sVar6;
        _Var18._M_p = _Var18._M_p + 0x20) {
      (*this->_vptr_cmLocalGenerator[8])(this,linkFlags,_Var18._M_p);
    }
    if (local_98 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,local_98,local_48,local_40,frameworkPath,linkPath);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
  }
  AppendPositionIndependentLinkerFlags(this,linkFlags,target,local_90,&local_68);
  AppendIPOLinkerFlags(this,linkFlags,target,local_90,&local_68);
LAB_0030f75e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(
  cmLinkLineComputer* linkLineComputer, const std::string& config,
  std::string& linkLibs, std::string& flags, std::string& linkFlags,
  std::string& frameworkPath, std::string& linkPath, cmGeneratorTarget* target)
{
  const std::string buildType = cmSystemTools::UpperCase(config);
  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  const std::string linkLanguage =
    linkLineComputer->GetLinkerLanguage(target, buildType);

  switch (target->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      this->GetStaticLibraryFlags(linkFlags, buildType, linkLanguage, target);
      break;
    case cmStateEnums::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
      CM_FALLTHROUGH;
    case cmStateEnums::SHARED_LIBRARY: {
      linkFlags = this->Makefile->GetSafeDefinition(libraryLinkVariable);
      linkFlags += " ";
      if (!buildType.empty()) {
        std::string build = libraryLinkVariable;
        build += "_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
      }
      if (this->Makefile->IsOn("WIN32") &&
          !(this->Makefile->IsOn("CYGWIN") || this->Makefile->IsOn("MINGW"))) {
        std::vector<cmSourceFile*> sources;
        target->GetSourceFiles(sources, buildType);
        std::string defFlag =
          this->Makefile->GetSafeDefinition("CMAKE_LINK_DEF_FILE_FLAG");
        for (cmSourceFile* sf : sources) {
          if (sf->GetExtension() == "def") {
            linkFlags += defFlag;
            linkFlags += this->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(sf->GetFullPath()), SHELL);
            linkFlags += " ";
          }
        }
      }
      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }
      std::vector<std::string> opts;
      target->GetLinkOptions(opts, config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, opts);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
    } break;
    case cmStateEnums::EXECUTABLE: {
      linkFlags += this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
      linkFlags += " ";
      if (!buildType.empty()) {
        std::string build = "CMAKE_EXE_LINKER_FLAGS_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
      }
      if (linkLanguage.empty()) {
        cmSystemTools::Error(
          "CMake can not determine linker language for target: " +
          target->GetName());
        return;
      }
      this->AddLanguageFlagsForLinking(flags, target, linkLanguage, buildType);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
      if (cmSystemTools::IsOn(
            this->Makefile->GetDefinition("BUILD_SHARED_LIBS"))) {
        std::string sFlagVar = std::string("CMAKE_SHARED_BUILD_") +
          linkLanguage + std::string("_FLAGS");
        linkFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        linkFlags += " ";
      }
      if (target->GetPropertyAsBool("WIN32_EXECUTABLE")) {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_WIN32_EXE");
        linkFlags += " ";
      } else {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_CONSOLE_EXE");
        linkFlags += " ";
      }
      if (target->IsExecutableWithExports()) {
        std::string exportFlagVar = "CMAKE_EXE_EXPORTS_";
        exportFlagVar += linkLanguage;
        exportFlagVar += "_FLAG";

        linkFlags += this->Makefile->GetSafeDefinition(exportFlagVar);
        linkFlags += " ";
      }

      std::string cmp0065Flags =
        this->GetLinkLibsCMP0065(linkLanguage, *target);
      if (!cmp0065Flags.empty()) {
        linkFlags += cmp0065Flags;
        linkFlags += " ";
      }

      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }
      std::vector<std::string> opts;
      target->GetLinkOptions(opts, config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, opts);
    } break;
    default:
      break;
  }

  this->AppendPositionIndependentLinkerFlags(linkFlags, target, config,
                                             linkLanguage);
  this->AppendIPOLinkerFlags(linkFlags, target, config, linkLanguage);
}